

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::internal::UntypedMapBase::InsertUniqueInList
          (UntypedMapBase *this,map_index_t b,NodeBase *node)

{
  bool bVar1;
  NodeBase *pNVar2;
  TableEntryPtr TVar3;
  NodeBase *first;
  NodeBase *node_local;
  map_index_t b_local;
  UntypedMapBase *this_local;
  
  bVar1 = TableEntryIsEmpty(this,b);
  if ((bVar1) || (bVar1 = ShouldInsertAfterHead(this,node), !bVar1)) {
    pNVar2 = TableEntryToNode(this->table_[b]);
    node->next = pNVar2;
    TVar3 = NodeToTableEntry(node);
    this->table_[b] = TVar3;
  }
  else {
    pNVar2 = TableEntryToNode(this->table_[b]);
    node->next = pNVar2->next;
    pNVar2->next = node;
  }
  return;
}

Assistant:

void InsertUniqueInList(map_index_t b, NodeBase* node) {
    if (!TableEntryIsEmpty(b) && ShouldInsertAfterHead(node)) {
      auto* first = TableEntryToNode(table_[b]);
      node->next = first->next;
      first->next = node;
    } else {
      node->next = TableEntryToNode(table_[b]);
      table_[b] = NodeToTableEntry(node);
    }
  }